

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

bool __thiscall kj::PathPtr::operator<(PathPtr *this,PathPtr other)

{
  ulong uVar1;
  String *pSVar2;
  int iVar3;
  ulong uVar4;
  char *__s2;
  char *__s1;
  long lVar5;
  byte unaff_R13B;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  
  uVar4 = other.parts.size_;
  uVar1 = (this->parts).size_;
  uVar6 = uVar4;
  if (uVar1 < uVar4) {
    uVar6 = uVar1;
  }
  bVar8 = uVar6 != 0;
  if (bVar8) {
    pSVar2 = (this->parts).ptr;
    lVar5 = 8;
    uVar7 = 1;
    do {
      __s1 = "";
      if (*(long *)((long)&(pSVar2->content).ptr + lVar5) != 0) {
        __s1 = *(char **)((long)pSVar2 + lVar5 + -8);
      }
      __s2 = "";
      if (*(long *)((long)&((other.parts.ptr)->content).ptr + lVar5) != 0) {
        __s2 = *(char **)((long)other.parts.ptr + lVar5 + -8);
      }
      iVar3 = strcmp(__s1,__s2);
      unaff_R13B = unaff_R13B & iVar3 == 0 | iVar3 < 0;
      if (iVar3 != 0) break;
      bVar8 = uVar7 < uVar6;
      lVar5 = lVar5 + 0x18;
      bVar9 = uVar7 != uVar6;
      uVar7 = uVar7 + 1;
    } while (bVar9);
  }
  if (!bVar8) {
    unaff_R13B = uVar1 < uVar4;
  }
  return (bool)(unaff_R13B & 1);
}

Assistant:

bool PathPtr::operator< (PathPtr other) const {
  for (size_t i = 0; i < kj::min(parts.size(), other.parts.size()); i++) {
    int comp = strcmp(parts[i].cStr(), other.parts[i].cStr());
    if (comp < 0) return true;
    if (comp > 0) return false;
  }

  return parts.size() < other.parts.size();
}